

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::optimize_color(crn_comp *this)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  endpoint_indices_details *peVar4;
  uint *puVar5;
  unpacked_endpoint *puVar6;
  optimize_color_params *poVar7;
  long in_RDI;
  uint i_4;
  uint best_bits;
  optimize_color_params *pParams;
  uint i_3;
  float weights [4];
  result remapping_trial [4];
  uint16 i_2;
  vector<crnlib::optimize_color_params::unpacked_endpoint> unpacked_endpoints;
  uint16 i_1;
  uint best_sum;
  uint16 selected;
  uint b;
  uint i_prev;
  uint i;
  vector<unsigned_int> sum;
  vector<unsigned_int> hist;
  uint16 n;
  undefined4 in_stack_fffffffffffffd78;
  uint in_stack_fffffffffffffd7c;
  result *in_stack_fffffffffffffd80;
  result *in_stack_fffffffffffffd90;
  result *prVar8;
  uint64 in_stack_fffffffffffffd98;
  result *prVar9;
  task_pool *in_stack_fffffffffffffda0;
  uint in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdad;
  uint16 in_stack_fffffffffffffdae;
  crn_comp *in_stack_fffffffffffffdb0;
  task_pool *in_stack_fffffffffffffdb8;
  result *local_210;
  uint local_1ec;
  uint local_1c4;
  uint local_150;
  uint local_14c;
  uint local_12c;
  float local_128 [4];
  result local_118 [4];
  result rStack_78;
  uint local_50;
  uint16 local_4a;
  uint local_48;
  uint local_44;
  uint local_40;
  vector<unsigned_int> local_30;
  vector<unsigned_int> local_20;
  ushort local_a;
  
  uVar3 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x14f0));
  local_a = (ushort)uVar3;
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
  local_44 = 0;
  local_48 = 0;
  while( true ) {
    uVar1 = local_48;
    uVar3 = vector<crnlib::dxt_hc::endpoint_indices_details>::size
                      ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x1530));
    if (uVar3 <= uVar1) break;
    peVar4 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                       ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x1530),
                        local_48);
    local_40 = (uint)(peVar4->field_0).field_0.color;
    if (((*(byte *)(in_RDI + 0x14d4) & 1) == 0) || ((local_48 & 1) == 0)) {
      peVar4 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                         ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x1530),
                          local_48);
      bVar2 = (peVar4->reference != '\0' ^ 0xffU) & 1;
    }
    else {
      peVar4 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                         ((vector<crnlib::dxt_hc::endpoint_indices_details> *)(in_RDI + 0x1530),
                          local_48);
      bVar2 = peVar4->reference;
    }
    if ((bVar2 != 0) && (local_40 != local_44)) {
      puVar5 = vector<unsigned_int>::operator[](&local_20,local_40 * local_a + local_44);
      *puVar5 = *puVar5 + 1;
      puVar5 = vector<unsigned_int>::operator[](&local_20,local_44 * local_a + local_40);
      *puVar5 = *puVar5 + 1;
      puVar5 = vector<unsigned_int>::operator[](&local_30,local_40);
      *puVar5 = *puVar5 + 1;
      puVar5 = vector<unsigned_int>::operator[](&local_30,local_44);
      *puVar5 = *puVar5 + 1;
    }
    local_48 = local_48 + 1;
    local_44 = local_40;
  }
  local_4a = 0;
  local_50 = 0;
  for (rStack_78._38_2_ = 0; uVar1 = local_50, (ushort)rStack_78._38_2_ < local_a;
      rStack_78._38_2_ = rStack_78._38_2_ + 1) {
    puVar5 = vector<unsigned_int>::operator[](&local_30,(uint)(ushort)rStack_78._38_2_);
    if (uVar1 < *puVar5) {
      puVar5 = vector<unsigned_int>::operator[](&local_30,(uint)(ushort)rStack_78._38_2_);
      local_50 = *puVar5;
      local_4a = rStack_78._38_2_;
    }
  }
  vector<crnlib::optimize_color_params::unpacked_endpoint>::vector
            ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd7c);
  for (rStack_78.endpoint_remapping.m_capacity._2_2_ = 0;
      rStack_78.endpoint_remapping.m_capacity._2_2_ < local_a;
      rStack_78.endpoint_remapping.m_capacity._2_2_ =
           rStack_78.endpoint_remapping.m_capacity._2_2_ + 1) {
    if ((*(byte *)(in_RDI + 0x14d3) & 1) == 0) {
      vector<unsigned_int>::operator[]
                ((vector<unsigned_int> *)(in_RDI + 0x14f0),
                 (uint)rStack_78.endpoint_remapping.m_capacity._2_2_);
      dxt1_block::unpack_color
                (in_stack_fffffffffffffdae,(bool)in_stack_fffffffffffffdad,in_stack_fffffffffffffda8
                );
      local_1c4 = rStack_78.endpoint_remapping.m_size;
    }
    else {
      puVar5 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)(in_RDI + 0x14f0),
                          (uint)rStack_78.endpoint_remapping.m_capacity._2_2_);
      local_1c4 = *puVar5 & 0xffffff;
    }
    puVar6 = vector<crnlib::optimize_color_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)
                        &rStack_78.packed_endpoints,
                        (uint)rStack_78.endpoint_remapping.m_capacity._2_2_);
    (puVar6->low).field_0.m_u32 = local_1c4;
    if ((*(byte *)(in_RDI + 0x14d3) & 1) == 0) {
      vector<unsigned_int>::operator[]
                ((vector<unsigned_int> *)(in_RDI + 0x14f0),
                 (uint)rStack_78.endpoint_remapping.m_capacity._2_2_);
      dxt1_block::unpack_color
                (in_stack_fffffffffffffdae,(bool)in_stack_fffffffffffffdad,in_stack_fffffffffffffda8
                );
      local_1ec = rStack_78.endpoint_remapping.m_p._4_4_;
    }
    else {
      puVar5 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)(in_RDI + 0x14f0),
                          (uint)rStack_78.endpoint_remapping.m_capacity._2_2_);
      local_1ec = *puVar5 >> 0x18;
    }
    puVar6 = vector<crnlib::optimize_color_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)
                        &rStack_78.packed_endpoints,
                        (uint)rStack_78.endpoint_remapping.m_capacity._2_2_);
    (puVar6->high).field_0.m_u32 = local_1ec;
  }
  local_210 = local_118;
  do {
    optimize_color_params::result::result(in_stack_fffffffffffffd90);
    local_210 = local_210 + 1;
  } while (local_210 != &rStack_78);
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.16666667;
  local_128[3] = 0.5;
  for (local_12c = 0; local_12c < 4; local_12c = local_12c + 1) {
    poVar7 = crnlib_new<crnlib::optimize_color_params>();
    puVar6 = vector<crnlib::optimize_color_params::unpacked_endpoint>::get_ptr
                       ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)
                        &rStack_78.packed_endpoints);
    poVar7->unpacked_endpoints = puVar6;
    puVar5 = vector<unsigned_int>::get_ptr(&local_20);
    poVar7->hist = puVar5;
    poVar7->n = local_a;
    poVar7->selected = local_4a;
    poVar7->weight = local_128[local_12c];
    poVar7->pResult = local_118 + local_12c;
    task_pool::
    queue_object_task<crnlib::crn_comp,void(crnlib::crn_comp::*)(unsigned_long_long,void*)>
              (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
               (offset_in_crn_comp_to_subr)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd90);
  }
  task_pool::join(in_stack_fffffffffffffda0);
  local_14c = 0xffffffff;
  for (local_150 = 0; local_150 < 4; local_150 = local_150 + 1) {
    if (local_118[local_150].total_bits < local_14c) {
      vector<unsigned_char>::swap
                ((vector<unsigned_char> *)in_stack_fffffffffffffd80,
                 (vector<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      vector<unsigned_short>::swap
                (&in_stack_fffffffffffffd80->endpoint_remapping,
                 (vector<unsigned_short> *)
                 CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_14c = local_118[local_150].total_bits;
    }
  }
  prVar8 = local_118;
  prVar9 = &rStack_78;
  do {
    prVar9 = prVar9 + -1;
    optimize_color_params::result::~result(in_stack_fffffffffffffd80);
  } while (prVar9 != prVar8);
  vector<crnlib::optimize_color_params::unpacked_endpoint>::~vector
            ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)in_stack_fffffffffffffd80);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffd80);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffd80);
  return;
}

Assistant:

void crn_comp::optimize_color() {
  uint16 n = m_color_endpoints.size();
  crnlib::vector<uint> hist(n * n);
  crnlib::vector<uint> sum(n);
  for (uint i, i_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i_prev = i) {
    i = m_endpoint_indices[b].color;
    if ((m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) && i != i_prev) {
      hist[i * n + i_prev]++;
      hist[i_prev * n + i]++;
      sum[i]++;
      sum[i_prev]++;
    }
  }
  uint16 selected = 0;
  uint best_sum = 0;
  for (uint16 i = 0; i < n; i++) {
    if (best_sum < sum[i]) {
      best_sum = sum[i];
      selected = i;
    }
  }
  crnlib::vector<optimize_color_params::unpacked_endpoint> unpacked_endpoints(n);
  for (uint16 i = 0; i < n; i++) {
    unpacked_endpoints[i].low.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] & 0xFFFFFF : dxt1_block::unpack_color(m_color_endpoints[i] & 0xFFFF, true).m_u32;
    unpacked_endpoints[i].high.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] >> 24 : dxt1_block::unpack_color(m_color_endpoints[i] >> 16, true).m_u32;
  }

  optimize_color_params::result remapping_trial[4];
  float weights[4] = {0, 0, 1.0f / 6.0f, 0.5f};
  for (uint i = 0; i < 4; i++) {
    optimize_color_params* pParams = crnlib_new<optimize_color_params>();
    pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
    pParams->hist = hist.get_ptr();
    pParams->n = n;
    pParams->selected = selected;
    pParams->weight = weights[i];
    pParams->pResult = remapping_trial + i;
    m_task_pool.queue_object_task(this, &crn_comp::optimize_color_endpoints_task, i, pParams);
  }
  m_task_pool.join();

  for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++) {
    if (remapping_trial[i].total_bits < best_bits) {
      m_packed_color_endpoints.swap(remapping_trial[i].packed_endpoints);
      m_endpoint_remaping[cColor].swap(remapping_trial[i].endpoint_remapping);
      best_bits = remapping_trial[i].total_bits;
    }
  }
}